

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsRowid(char *z)

{
  int iVar1;
  char *in_RDI;
  int local_4;
  
  iVar1 = sqlite3StrICmp(in_RDI,"_ROWID_");
  if (iVar1 == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = sqlite3StrICmp(in_RDI,"ROWID");
    if (iVar1 == 0) {
      local_4 = 1;
    }
    else {
      iVar1 = sqlite3StrICmp(in_RDI,"OID");
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsRowid(const char *z){
  if( sqlite3StrICmp(z, "_ROWID_")==0 ) return 1;
  if( sqlite3StrICmp(z, "ROWID")==0 ) return 1;
  if( sqlite3StrICmp(z, "OID")==0 ) return 1;
  return 0;
}